

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

int __thiscall asmjit::RALocalAllocator::init(RALocalAllocator *this,EVP_PKEY_CTX *ctx)

{
  RAAssignment *this_00;
  byte bVar1;
  byte bVar2;
  uint workId;
  BaseRAPass *pBVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  PhysToWorkMap *pPVar7;
  WorkToPhysMap *pWVar8;
  RAStackSlot *pRVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  void *__src;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint group;
  BaseRAPass *this_01;
  RAAssignment *pRVar17;
  ulong uVar18;
  long lVar19;
  uint32_t physId;
  
  pPVar7 = BaseRAPass::newPhysToWorkMap(this->_pass);
  this_01 = this->_pass;
  pWVar8 = BaseRAPass::newWorkToPhysMap(this_01);
  if (pWVar8 == (WorkToPhysMap *)0x0 || pPVar7 == (PhysToWorkMap *)0x0) {
    return 1;
  }
  if ((this->_curAssignment)._physToWorkMap == (PhysToWorkMap *)0x0) {
    if ((this->_curAssignment)._workToPhysMap != (WorkToPhysMap *)0x0) goto LAB_0011afba;
    this_01 = this->_pass;
    bVar1 = (this_01->_physRegCount).field_0._regs[0];
    uVar10 = (uint)(this_01->_physRegCount).field_0._regs[1] + (uint)bVar1;
    if (0xff < uVar10) goto LAB_0011afbf;
    uVar16 = (this_01->_physRegCount).field_0._regs[2] + uVar10;
    ctx = (EVP_PKEY_CTX *)(ulong)uVar16;
    if (0xff < uVar16) goto LAB_0011afc4;
    uVar13 = uVar16 * 0x1000000 | uVar10 * 0x10000 | (uint)bVar1 << 8;
    (this->_curAssignment)._layout.physIndex.super_RARegCount.field_0._packed = uVar13;
    uVar10 = (this_01->_physRegCount).field_0._packed;
    (this->_curAssignment)._layout.physCount.field_0._packed = uVar10;
    (this->_curAssignment)._layout.physTotal = (uVar10 >> 0x18) + uVar16;
    (this->_curAssignment)._layout.workCount = (this_01->_workRegs).super_ZoneVectorBase._size;
    (this->_curAssignment)._layout.workRegs = &this_01->_workRegs;
    (this->_curAssignment)._physToWorkMap = pPVar7;
    (this->_curAssignment)._workToPhysMap = pWVar8;
    lVar12 = 0;
    do {
      *(uint32_t **)((long)(this->_curAssignment)._physToWorkIds + lVar12) =
           pPVar7->workIds + (uVar13 >> ((byte)lVar12 & 0x1f) & 0xff);
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x20);
    pPVar7 = BaseRAPass::newPhysToWorkMap(this_01);
    this_01 = this->_pass;
    pWVar8 = BaseRAPass::newWorkToPhysMap(this_01);
    if (pWVar8 == (WorkToPhysMap *)0x0 || pPVar7 == (PhysToWorkMap *)0x0) {
      return 1;
    }
    if ((this->_tmpAssignment)._physToWorkMap != (PhysToWorkMap *)0x0) goto LAB_0011afc9;
    if ((this->_tmpAssignment)._workToPhysMap != (WorkToPhysMap *)0x0) goto LAB_0011afce;
    pBVar3 = this->_pass;
    bVar1 = (pBVar3->_physRegCount).field_0._regs[0];
    uVar10 = (uint)(pBVar3->_physRegCount).field_0._regs[1] + (uint)bVar1;
    ctx = (EVP_PKEY_CTX *)(ulong)uVar10;
    if (uVar10 < 0x100) {
      uVar16 = (pBVar3->_physRegCount).field_0._regs[2] + uVar10;
      this_01 = (BaseRAPass *)(ulong)uVar16;
      if (uVar16 < 0x100) {
        uVar13 = uVar16 * 0x1000000 | uVar10 * 0x10000 | (uint)bVar1 << 8;
        (this->_tmpAssignment)._layout.physIndex.super_RARegCount.field_0._packed = uVar13;
        uVar10 = (pBVar3->_physRegCount).field_0._packed;
        (this->_tmpAssignment)._layout.physCount.field_0._packed = uVar10;
        (this->_tmpAssignment)._layout.physTotal = (uVar10 >> 0x18) + uVar16;
        (this->_tmpAssignment)._layout.workCount = (pBVar3->_workRegs).super_ZoneVectorBase._size;
        (this->_tmpAssignment)._layout.workRegs = &pBVar3->_workRegs;
        (this->_tmpAssignment)._physToWorkMap = pPVar7;
        (this->_tmpAssignment)._workToPhysMap = pWVar8;
        lVar12 = 0;
        do {
          *(uint32_t **)((long)(this->_tmpAssignment)._physToWorkIds + lVar12) =
               pPVar7->workIds + (uVar13 >> ((byte)lVar12 & 0x1f) & 0xff);
          lVar12 = lVar12 + 8;
        } while (lVar12 != 0x20);
        return 0;
      }
      goto LAB_0011afd8;
    }
  }
  else {
    init((EVP_PKEY_CTX *)this_01);
LAB_0011afba:
    init((EVP_PKEY_CTX *)this_01);
LAB_0011afbf:
    init((EVP_PKEY_CTX *)this_01);
LAB_0011afc4:
    init((EVP_PKEY_CTX *)this_01);
LAB_0011afc9:
    init((EVP_PKEY_CTX *)this_01);
LAB_0011afce:
    init((EVP_PKEY_CTX *)this_01);
  }
  init((EVP_PKEY_CTX *)this_01);
LAB_0011afd8:
  init((EVP_PKEY_CTX *)this_01);
  pRVar17 = (RAAssignment *)(this_01->super_FuncPass).super_Pass._vptr_Pass;
  if (*(int *)pRVar17[2]._physToWorkIds == 0) {
LAB_0011b275:
    makeInitialAssignment();
    memcpy(pRVar17[1]._layout.workRegs,ctx,(ulong)*(uint *)(pRVar17->_physToWorkIds + 3) * 4 + 0x20)
    ;
    memcpy(*(void **)&pRVar17[1]._layout.physTotal,__src,
           (ulong)*(uint *)((long)pRVar17->_physToWorkIds + 0x1c));
    return 0;
  }
  lVar12 = *(long *)&pRVar17[2]._layout.physTotal;
  lVar4 = *(long *)((pRVar17[2]._physToWorkMap)->assigned)._masks;
  bVar1 = *(byte *)(lVar12 + 0xa4);
  this_00 = (RAAssignment *)((this_01->_allocator)._slots + 3);
  uVar10 = 0;
  uVar16 = 1;
  do {
    if ((ulong)bVar1 != 0) {
      lVar15 = 0;
      uVar18 = 0;
      do {
        lVar19 = 4;
        lVar14 = lVar15;
        do {
          if (*(byte *)(lVar12 + 0xa4) <= (byte)uVar18) {
            makeInitialAssignment();
LAB_0011b25c:
            makeInitialAssignment();
LAB_0011b261:
            makeInitialAssignment();
LAB_0011b266:
            makeInitialAssignment();
LAB_0011b26b:
            makeInitialAssignment();
LAB_0011b270:
            makeInitialAssignment();
            goto LAB_0011b275;
          }
          lVar5 = *(long *)(*(long *)(lVar12 + 0x240) + lVar14 * 2);
          uVar13 = uVar16;
          if ((lVar5 == 0) || (puVar6 = *(uint **)(lVar5 + 0x20), puVar6 == (uint *)0x0))
          goto LAB_0011b0c4;
          workId = *puVar6;
          if (*(uint *)(lVar4 + 0x80) <= workId) goto LAB_0011b25c;
          if ((*(ulong *)(*(long *)(lVar4 + 0x78) + (ulong)(workId >> 6) * 8) >>
               ((ulong)workId & 0x3f) & 1) == 0) goto LAB_0011b0c4;
          if (*(uint *)((long)(this_01->_allocator)._slots + 0x24) <= workId) goto LAB_0011b261;
          if (*(char *)((long)&(this_01->_allocator)._slots[6]->next + (ulong)workId) != -1)
          goto LAB_0011b0c4;
          group = puVar6[8] >> 8 & 0xf;
          ctx = (EVP_PKEY_CTX *)(ulong)group;
          if (3 < group) goto LAB_0011b266;
          uVar11 = ~*(uint *)((long)&(this_01->_allocator)._slots[7]->next + (ulong)(group * 4)) &
                   *(uint *)((long)(this_01->_allocator)._slots + ((ulong)(group * 4) - 8));
          if (uVar10 == 0) {
            bVar2 = *(byte *)((long)puVar6 + 0x3a);
            physId = (uint32_t)bVar2;
            uVar13 = 2;
            if ((bVar2 == 0xff) || ((uVar11 >> (bVar2 & 0x1f) & 1) == 0)) goto LAB_0011b0c4;
            pRVar17 = this_00;
            RAAssignment::assign(this_00,group,workId,(uint)bVar2,1);
            if (uVar18 < 0x10) goto LAB_0011b170;
            goto LAB_0011b270;
          }
          if (uVar11 == 0) {
            if (*(long *)(puVar6 + 6) == 0) {
              uVar16 = *(uint *)((long)pRVar17[6]._physToWorkIds + 4);
              ctx = (EVP_PKEY_CTX *)(ulong)uVar16;
              pRVar9 = RAStackAllocator::newSlot
                                 ((RAStackAllocator *)(pRVar17 + 7),uVar16,
                                  *(uint32_t *)(*(long *)(puVar6 + 2) + 8),
                                  (uint)*(byte *)(*(long *)(puVar6 + 2) + 0xc),1);
              *(RAStackSlot **)(puVar6 + 6) = pRVar9;
              uVar16 = puVar6[9] | 2;
              puVar6[9] = uVar16;
              if (pRVar9 == (RAStackSlot *)0x0) {
                return 1;
              }
              pRVar17 = (RAAssignment *)(this_01->super_FuncPass).super_Pass._vptr_Pass;
            }
            else {
              uVar16 = puVar6[9];
            }
            puVar6[9] = uVar16 | 8;
            *(int *)&pRVar17[0xb]._workToPhysMap = *(int *)&pRVar17[0xb]._workToPhysMap + 1;
          }
          else {
            physId = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> physId & 1) == 0; physId = physId + 1) {
              }
            }
            pRVar17 = this_00;
            RAAssignment::assign(this_00,group,workId,physId,1);
            if (0xf < uVar18) goto LAB_0011b26b;
LAB_0011b170:
            pRVar17 = (RAAssignment *)(this_01->super_FuncPass).super_Pass._vptr_Pass;
            *(uint *)((long)pRVar17[7]._physToWorkIds + lVar14 + 0xc) =
                 (uint)*(byte *)(*(long *)(puVar6 + 2) + 0xd) +
                 (physId << 0x10 | (puVar6[8] & 0xf8) << 0x15) + 0x100;
            uVar13 = uVar16;
          }
LAB_0011b0c4:
          uVar16 = uVar13;
          lVar14 = lVar14 + 4;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x10;
      } while (uVar18 != bVar1);
    }
    uVar10 = uVar10 + 1;
    if (uVar16 <= uVar10) {
      return 0;
    }
  } while( true );
}

Assistant:

Error RALocalAllocator::init() noexcept {
  PhysToWorkMap* physToWorkMap;
  WorkToPhysMap* workToPhysMap;

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _curAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _curAssignment.initMaps(physToWorkMap, workToPhysMap);

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _tmpAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _tmpAssignment.initMaps(physToWorkMap, workToPhysMap);

  return kErrorOk;
}